

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_toradix(mp_int *a,char *str,int radix)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  mp_int t;
  mp_digit d;
  mp_int local_50;
  mp_digit local_38;
  
  if (radix - 0x41U < 0xffffffc1) {
    return -3;
  }
  if (a->used == 0) {
    str[0] = '0';
    str[1] = '\0';
  }
  else {
    iVar3 = mp_init_copy(&local_50,a);
    if (iVar3 != 0) {
      return iVar3;
    }
    if (local_50.sign == 1) {
      *str = '-';
      str = str + 1;
      local_50.sign = 0;
    }
    if (local_50.used == 0) {
      uVar7 = 0;
      pcVar4 = str;
    }
    else {
      uVar7 = 0;
      do {
        iVar3 = mp_div_d(&local_50,(ulong)(uint)radix,&local_50,&local_38);
        if (iVar3 != 0) {
          if (local_50.dp == (mp_digit *)0x0) {
            return iVar3;
          }
          if (0 < (long)local_50.used) {
            memset(local_50.dp,0,(long)local_50.used << 3);
          }
          free(local_50.dp);
          return iVar3;
        }
        str[uVar7] = mp_s_rmap[local_38];
        uVar7 = uVar7 + 1;
      } while (local_50.used != 0);
      pcVar4 = str + uVar7;
    }
    if (1 < (uint)uVar7) {
      lVar6 = 0;
      lVar5 = (uVar7 & 0xffffffff) - 2;
      do {
        cVar1 = str[lVar6];
        str[lVar6] = str[lVar5 + 1];
        str[lVar5 + 1] = cVar1;
        lVar6 = lVar6 + 1;
        bVar2 = lVar6 < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar2);
    }
    *pcVar4 = '\0';
    if (local_50.dp != (mp_digit *)0x0) {
      free(local_50.dp);
      return 0;
    }
  }
  return 0;
}

Assistant:

int mp_toradix (mp_int * a, char *str, int radix)
{
  int     res, digs;
  mp_int  t;
  mp_digit d;
  char   *_s = str;

  /* check range of the radix */
  if (radix < 2 || radix > 64) {
    return MP_VAL;
  }

  /* quick out if its zero */
  if (mp_iszero(a) == 1) {
     *str++ = '0';
     *str = '\0';
     return MP_OKAY;
  }

  if ((res = mp_init_copy (&t, a)) != MP_OKAY) {
    return res;
  }

  /* if it is negative output a - */
  if (t.sign == MP_NEG) {
    ++_s;
    *str++ = '-';
    t.sign = MP_ZPOS;
  }

  digs = 0;
  while (mp_iszero (&t) == 0) {
    if ((res = mp_div_d (&t, (mp_digit) radix, &t, &d)) != MP_OKAY) {
      mp_clear (&t);
      return res;
    }
    *str++ = mp_s_rmap[d];
    ++digs;
  }

  /* reverse the digits of the string.  In this case _s points
   * to the first digit [exluding the sign] of the number]
   */
  bn_reverse ((unsigned char *)_s, digs);

  /* append a NULL so the string is properly terminated */
  *str = '\0';

  mp_clear (&t);
  return MP_OKAY;
}